

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utp_stream.hpp
# Opt level: O0

void __thiscall
libtorrent::aux::utp_stream::
async_write_some<boost::asio::const_buffer,boost::asio::detail::write_op<libtorrent::aux::utp_stream,boost::asio::mutable_buffer,boost::asio::mutable_buffer_const*,boost::asio::detail::transfer_all_t,boost::asio::ssl::detail::io_op<libtorrent::aux::utp_stream,boost::asio::ssl::detail::read_op<boost::asio::mutable_buffer>,std::_Bind<void(libtorrent::aux::http_connection::*(std::shared_ptr<libtorrent::aux::http_connection>,std::_Placeholder<1>,std::_Placeholder<2>))(boost::system::error_code_const&,unsigned_long)>>>>
          (utp_stream *this,const_buffer *buffers,
          write_op<libtorrent::aux::utp_stream,_boost::asio::mutable_buffer,_const_boost::asio::mutable_buffer_*,_boost::asio::detail::transfer_all_t,_boost::asio::ssl::detail::io_op<libtorrent::aux::utp_stream,_boost::asio::ssl::detail::read_op<boost::asio::mutable_buffer>,_std::_Bind<void_(libtorrent::aux::http_connection::*(std::shared_ptr<libtorrent::aux::http_connection>,_std::_Placeholder<1>,_std::_Placeholder<2>))(const_boost::system::error_code_&,_unsigned_long)>_>_>
          *handler)

{
  io_context *piVar1;
  bool bVar2;
  size_t sVar3;
  void *buf;
  unsigned_long local_2f8;
  error_code local_2f0;
  type local_2e0;
  const_buffer *local_240;
  const_buffer *end;
  const_buffer *i;
  size_t bytes_added;
  basic_errors local_21c;
  type local_218;
  unsigned_long local_180;
  basic_errors local_174;
  type local_170;
  unsigned_long local_c8;
  basic_errors local_bc;
  type local_b8;
  write_op<libtorrent::aux::utp_stream,_boost::asio::mutable_buffer,_const_boost::asio::mutable_buffer_*,_boost::asio::detail::transfer_all_t,_boost::asio::ssl::detail::io_op<libtorrent::aux::utp_stream,_boost::asio::ssl::detail::read_op<boost::asio::mutable_buffer>,_std::_Bind<void_(libtorrent::aux::http_connection::*(std::shared_ptr<libtorrent::aux::http_connection>,_std::_Placeholder<1>,_std::_Placeholder<2>))(const_boost::system::error_code_&,_unsigned_long)>_>_>
  *local_20;
  write_op<libtorrent::aux::utp_stream,_boost::asio::mutable_buffer,_const_boost::asio::mutable_buffer_*,_boost::asio::detail::transfer_all_t,_boost::asio::ssl::detail::io_op<libtorrent::aux::utp_stream,_boost::asio::ssl::detail::read_op<boost::asio::mutable_buffer>,_std::_Bind<void_(libtorrent::aux::http_connection::*(std::shared_ptr<libtorrent::aux::http_connection>,_std::_Placeholder<1>,_std::_Placeholder<2>))(const_boost::system::error_code_&,_unsigned_long)>_>_>
  *handler_local;
  const_buffer *buffers_local;
  utp_stream *this_local;
  
  local_20 = handler;
  handler_local =
       (write_op<libtorrent::aux::utp_stream,_boost::asio::mutable_buffer,_const_boost::asio::mutable_buffer_*,_boost::asio::detail::transfer_all_t,_boost::asio::ssl::detail::io_op<libtorrent::aux::utp_stream,_boost::asio::ssl::detail::read_op<boost::asio::mutable_buffer>,_std::_Bind<void_(libtorrent::aux::http_connection::*(std::shared_ptr<libtorrent::aux::http_connection>,_std::_Placeholder<1>,_std::_Placeholder<2>))(const_boost::system::error_code_&,_unsigned_long)>_>_>
        *)buffers;
  buffers_local = (const_buffer *)this;
  if (this->m_impl == (utp_socket_impl *)0x0) {
    piVar1 = this->m_io_service;
    local_bc = not_connected;
    local_c8 = 0;
    ::std::
    bind<void,boost::asio::detail::write_op<libtorrent::aux::utp_stream,boost::asio::mutable_buffer,boost::asio::mutable_buffer_const*,boost::asio::detail::transfer_all_t,boost::asio::ssl::detail::io_op<libtorrent::aux::utp_stream,boost::asio::ssl::detail::read_op<boost::asio::mutable_buffer>,std::_Bind<void(libtorrent::aux::http_connection::*(std::shared_ptr<libtorrent::aux::http_connection>,std::_Placeholder<1>,std::_Placeholder<2>))(boost::system::error_code_const&,unsigned_long)>>>,boost::asio::error::basic_errors,unsigned_long>
              (&local_b8,handler,&local_bc,&local_c8);
    boost::asio::
    post<boost::asio::io_context,std::_Bind_result<void,boost::asio::detail::write_op<libtorrent::aux::utp_stream,boost::asio::mutable_buffer,boost::asio::mutable_buffer_const*,boost::asio::detail::transfer_all_t,boost::asio::ssl::detail::io_op<libtorrent::aux::utp_stream,boost::asio::ssl::detail::read_op<boost::asio::mutable_buffer>,std::_Bind<void(libtorrent::aux::http_connection::*(std::shared_ptr<libtorrent::aux::http_connection>,std::_Placeholder<1>,std::_Placeholder<2>))(boost::system::error_code_const&,unsigned_long)>>>(boost::asio::error::basic_errors,unsigned_long)>>
              (piVar1,&local_b8,(type *)0x0);
    ::std::
    _Bind_result<void,_boost::asio::detail::write_op<libtorrent::aux::utp_stream,_boost::asio::mutable_buffer,_const_boost::asio::mutable_buffer_*,_boost::asio::detail::transfer_all_t,_boost::asio::ssl::detail::io_op<libtorrent::aux::utp_stream,_boost::asio::ssl::detail::read_op<boost::asio::mutable_buffer>,_std::_Bind<void_(libtorrent::aux::http_connection::*(std::shared_ptr<libtorrent::aux::http_connection>,_std::_Placeholder<1>,_std::_Placeholder<2>))(const_boost::system::error_code_&,_unsigned_long)>_>_>_(boost::asio::error::basic_errors,_unsigned_long)>
    ::~_Bind_result(&local_b8);
  }
  else {
    bVar2 = ::std::function::operator_cast_to_bool((function *)&this->m_write_handler);
    if (bVar2) {
      piVar1 = this->m_io_service;
      local_174 = operation_not_supported;
      local_180 = 0;
      ::std::
      bind<void,boost::asio::detail::write_op<libtorrent::aux::utp_stream,boost::asio::mutable_buffer,boost::asio::mutable_buffer_const*,boost::asio::detail::transfer_all_t,boost::asio::ssl::detail::io_op<libtorrent::aux::utp_stream,boost::asio::ssl::detail::read_op<boost::asio::mutable_buffer>,std::_Bind<void(libtorrent::aux::http_connection::*(std::shared_ptr<libtorrent::aux::http_connection>,std::_Placeholder<1>,std::_Placeholder<2>))(boost::system::error_code_const&,unsigned_long)>>>,boost::asio::error::basic_errors,unsigned_long>
                (&local_170,handler,&local_174,&local_180);
      boost::asio::
      post<boost::asio::io_context,std::_Bind_result<void,boost::asio::detail::write_op<libtorrent::aux::utp_stream,boost::asio::mutable_buffer,boost::asio::mutable_buffer_const*,boost::asio::detail::transfer_all_t,boost::asio::ssl::detail::io_op<libtorrent::aux::utp_stream,boost::asio::ssl::detail::read_op<boost::asio::mutable_buffer>,std::_Bind<void(libtorrent::aux::http_connection::*(std::shared_ptr<libtorrent::aux::http_connection>,std::_Placeholder<1>,std::_Placeholder<2>))(boost::system::error_code_const&,unsigned_long)>>>(boost::asio::error::basic_errors,unsigned_long)>>
                (piVar1,&local_170,(type *)0x0);
      ::std::
      _Bind_result<void,_boost::asio::detail::write_op<libtorrent::aux::utp_stream,_boost::asio::mutable_buffer,_const_boost::asio::mutable_buffer_*,_boost::asio::detail::transfer_all_t,_boost::asio::ssl::detail::io_op<libtorrent::aux::utp_stream,_boost::asio::ssl::detail::read_op<boost::asio::mutable_buffer>,_std::_Bind<void_(libtorrent::aux::http_connection::*(std::shared_ptr<libtorrent::aux::http_connection>,_std::_Placeholder<1>,_std::_Placeholder<2>))(const_boost::system::error_code_&,_unsigned_long)>_>_>_(boost::asio::error::basic_errors,_unsigned_long)>
      ::~_Bind_result(&local_170);
    }
    else {
      bVar2 = check_fin_sent(this);
      if (bVar2) {
        piVar1 = this->m_io_service;
        local_21c = broken_pipe;
        bytes_added = 0;
        ::std::
        bind<void,boost::asio::detail::write_op<libtorrent::aux::utp_stream,boost::asio::mutable_buffer,boost::asio::mutable_buffer_const*,boost::asio::detail::transfer_all_t,boost::asio::ssl::detail::io_op<libtorrent::aux::utp_stream,boost::asio::ssl::detail::read_op<boost::asio::mutable_buffer>,std::_Bind<void(libtorrent::aux::http_connection::*(std::shared_ptr<libtorrent::aux::http_connection>,std::_Placeholder<1>,std::_Placeholder<2>))(boost::system::error_code_const&,unsigned_long)>>>,boost::asio::error::basic_errors,unsigned_long>
                  (&local_218,handler,&local_21c,&bytes_added);
        boost::asio::
        post<boost::asio::io_context,std::_Bind_result<void,boost::asio::detail::write_op<libtorrent::aux::utp_stream,boost::asio::mutable_buffer,boost::asio::mutable_buffer_const*,boost::asio::detail::transfer_all_t,boost::asio::ssl::detail::io_op<libtorrent::aux::utp_stream,boost::asio::ssl::detail::read_op<boost::asio::mutable_buffer>,std::_Bind<void(libtorrent::aux::http_connection::*(std::shared_ptr<libtorrent::aux::http_connection>,std::_Placeholder<1>,std::_Placeholder<2>))(boost::system::error_code_const&,unsigned_long)>>>(boost::asio::error::basic_errors,unsigned_long)>>
                  (piVar1,&local_218,(type *)0x0);
        ::std::
        _Bind_result<void,_boost::asio::detail::write_op<libtorrent::aux::utp_stream,_boost::asio::mutable_buffer,_const_boost::asio::mutable_buffer_*,_boost::asio::detail::transfer_all_t,_boost::asio::ssl::detail::io_op<libtorrent::aux::utp_stream,_boost::asio::ssl::detail::read_op<boost::asio::mutable_buffer>,_std::_Bind<void_(libtorrent::aux::http_connection::*(std::shared_ptr<libtorrent::aux::http_connection>,_std::_Placeholder<1>,_std::_Placeholder<2>))(const_boost::system::error_code_&,_unsigned_long)>_>_>_(boost::asio::error::basic_errors,_unsigned_long)>
        ::~_Bind_result(&local_218);
      }
      else {
        i = (const_buffer *)0x0;
        end = boost::asio::buffer_sequence_begin<boost::asio::const_buffer>
                        ((const_buffer *)handler_local,(type *)0x0);
        local_240 = boost::asio::buffer_sequence_end<boost::asio::const_buffer>
                              ((const_buffer *)handler_local,(type *)0x0);
        for (; end != local_240; end = end + 1) {
          sVar3 = boost::asio::const_buffer::size(end);
          if (sVar3 != 0) {
            buf = boost::asio::const_buffer::data(end);
            sVar3 = boost::asio::const_buffer::size(end);
            add_write_buffer(this,buf,(int)sVar3);
            sVar3 = boost::asio::const_buffer::size(end);
            i = (const_buffer *)((long)&i->data_ + sVar3);
          }
        }
        if (i == (const_buffer *)0x0) {
          piVar1 = this->m_io_service;
          boost::system::error_code::error_code(&local_2f0);
          local_2f8 = 0;
          ::std::
          bind<void,boost::asio::detail::write_op<libtorrent::aux::utp_stream,boost::asio::mutable_buffer,boost::asio::mutable_buffer_const*,boost::asio::detail::transfer_all_t,boost::asio::ssl::detail::io_op<libtorrent::aux::utp_stream,boost::asio::ssl::detail::read_op<boost::asio::mutable_buffer>,std::_Bind<void(libtorrent::aux::http_connection::*(std::shared_ptr<libtorrent::aux::http_connection>,std::_Placeholder<1>,std::_Placeholder<2>))(boost::system::error_code_const&,unsigned_long)>>>,boost::system::error_code,unsigned_long>
                    (&local_2e0,handler,&local_2f0,&local_2f8);
          boost::asio::
          post<boost::asio::io_context,std::_Bind_result<void,boost::asio::detail::write_op<libtorrent::aux::utp_stream,boost::asio::mutable_buffer,boost::asio::mutable_buffer_const*,boost::asio::detail::transfer_all_t,boost::asio::ssl::detail::io_op<libtorrent::aux::utp_stream,boost::asio::ssl::detail::read_op<boost::asio::mutable_buffer>,std::_Bind<void(libtorrent::aux::http_connection::*(std::shared_ptr<libtorrent::aux::http_connection>,std::_Placeholder<1>,std::_Placeholder<2>))(boost::system::error_code_const&,unsigned_long)>>>(boost::system::error_code,unsigned_long)>>
                    (piVar1,&local_2e0,(type *)0x0);
          ::std::
          _Bind_result<void,_boost::asio::detail::write_op<libtorrent::aux::utp_stream,_boost::asio::mutable_buffer,_const_boost::asio::mutable_buffer_*,_boost::asio::detail::transfer_all_t,_boost::asio::ssl::detail::io_op<libtorrent::aux::utp_stream,_boost::asio::ssl::detail::read_op<boost::asio::mutable_buffer>,_std::_Bind<void_(libtorrent::aux::http_connection::*(std::shared_ptr<libtorrent::aux::http_connection>,_std::_Placeholder<1>,_std::_Placeholder<2>))(const_boost::system::error_code_&,_unsigned_long)>_>_>_(boost::system::error_code,_unsigned_long)>
          ::~_Bind_result(&local_2e0);
        }
        else {
          ::std::function<void(boost::system::error_code_const&,unsigned_long)>::operator=
                    ((function<void(boost::system::error_code_const&,unsigned_long)> *)
                     &this->m_write_handler,handler);
          issue_write(this);
        }
      }
    }
  }
  return;
}

Assistant:

void async_write_some(Const_Buffers const& buffers, Handler handler)
	{
		if (m_impl == nullptr)
		{
			post(m_io_service, std::bind<void>(std::move(handler)
				, boost::asio::error::not_connected, std::size_t(0)));
			return;
		}

		TORRENT_ASSERT(!m_write_handler);
		if (m_write_handler)
		{
			post(m_io_service, std::bind<void>(std::move(handler)
				, boost::asio::error::operation_not_supported, std::size_t(0)));
			return;
		}

		if (check_fin_sent())
		{
			// we can't send more data after closing the socket
			post(m_io_service, std::bind<void>(std::move(handler)
				, boost::asio::error::broken_pipe, std::size_t(0)));
			return;
		}

		std::size_t bytes_added = 0;
		for (auto i = buffer_sequence_begin(buffers)
			, end(buffer_sequence_end(buffers)); i != end; ++i)
		{
			if (i->size() == 0) continue;
			add_write_buffer(i->data(), int(i->size()));
			bytes_added += i->size();
		}
		if (bytes_added == 0)
		{
			// if we're writing 0 bytes, post handler immediately
			// asio's SSL layer depends on this behavior
			post(m_io_service, std::bind<void>(std::move(handler), error_code(), std::size_t(0)));
			return;
		}
		m_write_handler = std::move(handler);
		issue_write();
	}